

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_13::NameApplier::OnCallIndirectExpr(NameApplier *this,CallIndirectExpr *expr)

{
  Result RVar1;
  
  if (((expr->decl).has_func_type == true) &&
     (RVar1 = UseNameForFuncTypeVar(this,&(expr->decl).type_var), RVar1.enum_ == Error)) {
    return (Result)Error;
  }
  RVar1 = UseNameForTableVar(this,&expr->table);
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result NameApplier::OnCallIndirectExpr(CallIndirectExpr* expr) {
  if (expr->decl.has_func_type) {
    CHECK_RESULT(UseNameForFuncTypeVar(&expr->decl.type_var));
  }
  CHECK_RESULT(UseNameForTableVar(&expr->table));
  return Result::Ok;
}